

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O0

bool __thiscall cmValue::IsInternallyOn(cmValue *this,string_view value)

{
  size_type sVar1;
  const_reference pvVar2;
  bool local_1a;
  bool local_19;
  undefined1 local_18 [8];
  string_view value_local;
  
  value_local._M_len = value._M_len;
  local_18 = (undefined1  [8])this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_18);
  local_19 = false;
  if (sVar1 == 4) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_18,0);
    if ((*pvVar2 != 'I') &&
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_18,0),
       *pvVar2 != 'i')) {
      return false;
    }
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_18,1);
    local_19 = false;
    if (*pvVar2 == '_') {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_18,2);
      if ((*pvVar2 != 'O') &&
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_18,2),
         *pvVar2 != 'o')) {
        return false;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_18,3);
      local_1a = true;
      if (*pvVar2 != 'N') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_18,3);
        local_1a = *pvVar2 == 'n';
      }
      local_19 = local_1a;
    }
  }
  return local_19;
}

Assistant:

bool cmValue::IsInternallyOn(cm::string_view value) noexcept
{
  return (value.size() == 4) &&             //
    (value[0] == 'I' || value[0] == 'i') && //
    (value[1] == '_') &&                    //
    (value[2] == 'O' || value[2] == 'o') && //
    (value[3] == 'N' || value[3] == 'n');
}